

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStoreChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_16b72::InstrumentMemoryAccesses::visitMemIntrinsic
          (InstrumentMemoryAccesses *this,MemIntrinsic *MI)

{
  IRBuilder<llvm::ConstantFolder,_llvm::IRBuilderDefaultInserter> *this_00;
  Type *DestTy;
  bool bVar1;
  Value *pVVar2;
  Value *pVVar3;
  CallBase *this_01;
  Child local_58 [2];
  
  llvm::IRBuilderBase::SetInsertPoint(&this->Builder->super_IRBuilderBase,(Instruction *)MI);
  this_00 = this->Builder;
  pVVar2 = llvm::CallBase::getArgOperand((CallBase *)MI,2);
  DestTy = (Type *)this->SizeTy;
  llvm::Twine::Twine((Twine *)&local_58[0].ptrAndLength,"");
  pVVar2 = llvm::IRBuilderBase::CreateIntCast
                     (&this_00->super_IRBuilderBase,pVVar2,DestTy,false,
                      (Twine *)&local_58[0].ptrAndLength);
  local_58[0]._0_8_ = MI;
  bVar1 = llvm::
          isa_impl_wrap<llvm::MemTransferInst,_const_llvm::MemIntrinsic_*,_const_llvm::MemIntrinsic_*>
          ::doit((MemIntrinsic **)&local_58[0].twine);
  this_01 = (CallBase *)0x0;
  if (bVar1) {
    local_58[0]._0_8_ = MI;
    bVar1 = llvm::
            isa_impl_wrap<llvm::MemTransferInst,_const_llvm::MemIntrinsic_*,_const_llvm::MemIntrinsic_*>
            ::doit((MemIntrinsic **)&local_58[0].twine);
    this_01 = (CallBase *)MI;
    if (!bVar1) {
      __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                    "/usr/lib/llvm-14/include/llvm/Support/Casting.h",0x10d,
                    "typename cast_retty<X, Y *>::ret_type llvm::cast(Y *) [X = llvm::MemTransferInst, Y = llvm::MemIntrinsic]"
                   );
    }
  }
  if (this_01 != (CallBase *)0x0) {
    llvm::CallBase::getArgOperand(this_01,1);
    pVVar3 = (Value *)llvm::Value::stripPointerCasts();
    instrument(this,pVVar3,pVVar2,this->LoadCheckFunction,(Instruction *)MI);
  }
  llvm::CallBase::getArgOperand((CallBase *)MI,0);
  pVVar3 = (Value *)llvm::Value::stripPointerCasts();
  instrument(this,pVVar3,pVVar2,this->StoreCheckFunction,(Instruction *)MI);
  LOCK();
  IntrinsicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i =
       (__atomic_base<unsigned_int>)
       ((int)IntrinsicsInstrumented.Value.super___atomic_base<unsigned_int>._M_i + 1);
  UNLOCK();
  if (((byte)IntrinsicsInstrumented.Initialized._M_base._M_i & 1) == 0) {
    llvm::TrackingStatistic::RegisterStatistic();
  }
  return;
}

Assistant:

void InstrumentMemoryAccesses::visitMemIntrinsic(MemIntrinsic &MI) {
    // Instrument llvm.mem[set|cpy|move].* calls with load/store checks.
    Builder->SetInsertPoint(&MI);
    Value *AccessSize = Builder->CreateIntCast(MI.getLength(), SizeTy,
            /*isSigned=*/false);

    // memcpy and memmove have a source memory area but memset doesn't
    if (MemTransferInst *MTI = dyn_cast<MemTransferInst>(&MI))
        instrument(MTI->getSource(), AccessSize, LoadCheckFunction, MI);
    instrument(MI.getDest(), AccessSize, StoreCheckFunction, MI);
    ++IntrinsicsInstrumented;
}